

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::RunPeeps(FlowGraph *this)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint sourceContextId;
  uint functionId;
  int32 iVar6;
  undefined4 *puVar7;
  LabelInstr *pLVar8;
  char *deadLabel;
  LabelInstr *pLVar9;
  RegOpnd *pRVar10;
  Instr *instr;
  undefined **branchInstr;
  LabelInstr *cmpInstr;
  LabelInstr *instr_00;
  
  BVar5 = Func::HasTry(this->func);
  if (BVar5 == 0) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FGPeepsPhase,sourceContextId,functionId);
    if (!bVar3) {
      pLVar9 = (LabelInstr *)this->func->m_headInstr;
      branchInstr = &PTR_013e5f18;
      puVar7 = (undefined4 *)__tls_get_addr();
      bVar3 = false;
      do {
        deadLabel = (char *)branchInstr;
        instr_00 = (LabelInstr *)0x0;
switchD_003f6cc9_caseD_18b:
        cmpInstr = pLVar9;
        if (cmpInstr == (LabelInstr *)0x0) {
          return;
        }
        pLVar9 = (LabelInstr *)(cmpInstr->super_Instr).m_next;
        OVar1 = (cmpInstr->super_Instr).m_opcode;
        switch(OVar1) {
        case Label:
          deadLabel = (char *)cmpInstr;
          pLVar8 = IR::Instr::AsLabelInstr(&cmpInstr->super_Instr);
          if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (pLVar8->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>
               .super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar8->labelRefs) &&
             ((pLVar8->field_0x78 & 4) == 0)) {
            deadLabel = (char *)IR::Instr::AsLabelInstr(&cmpInstr->super_Instr);
            pLVar9 = (LabelInstr *)
                     Peeps::PeepUnreachableLabel((LabelInstr *)deadLabel,false,(bool *)0x0);
          }
          goto switchD_003f6cc9_caseD_18b;
        case StatementBoundary:
          IR::Instr::ClearByteCodeOffset(&cmpInstr->super_Instr);
          instr = IR::Instr::GetNextRealInstrOrLabel(&cmpInstr->super_Instr);
          IR::Instr::SetByteCodeOffset(&cmpInstr->super_Instr,instr);
          deadLabel = (char *)cmpInstr;
        case MultiBr:
          goto switchD_003f6cc9_caseD_18b;
        case BrHasSideEffects:
        case BrFncEqApply:
        case BrUnGe_A:
        case BrUnGt_A:
        case BrUnLt_A:
        case BrUnLe_A:
        case BrOnNoLocalProperty:
        case BrNotEq_A:
        case BrNotNeq_A:
        case BrSrNotEq_A:
        case BrSrNotNeq_A:
        case BrNotGe_A:
        case BrNotGt_A:
        case BrNotLt_A:
        case BrNotLe_A:
        case BrNotAddr_A:
        case BrAddr_A:
        case BrEq_I4:
        case BrGe_I4:
        case BrUnGe_I4:
        case BrGt_I4:
        case BrUnGt_I4:
        case BrLt_I4:
        case BrUnLt_I4:
        case BrLe_I4:
        case BrUnLe_I4:
        case BrNeq_I4:
switchD_003f6cc9_caseD_18c:
          if (bVar3) {
            UnsignedCmpPeep(this,&cmpInstr->super_Instr);
          }
          deadLabel = (char *)IR::Instr::AsBranchInstr(&cmpInstr->super_Instr);
          pLVar9 = (LabelInstr *)Peeps::PeepBranch((BranchInstr *)deadLabel,(bool *)0x0);
          goto switchD_003f6cc9_caseD_18b;
        case BrTrue_I4:
        case BrFalse_I4:
switchD_003f6cc9_caseD_1a6:
          if (instr_00 != (LabelInstr *)0x0) {
            if (((instr_00->super_Instr).m_dst)->m_type == TyInt32) {
              if ((OVar1 & ~ExtendedOpcodePrefix) != BrTrue_I4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                deadLabel = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                ;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                   ,0x369,
                                   "(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4)"
                                   ,
                                   "instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4"
                                  );
                if (!bVar4) goto LAB_003f6f2a;
                *puVar7 = 0;
              }
              pLVar9 = (LabelInstr *)PeepTypedCm((FlowGraph *)deadLabel,&instr_00->super_Instr);
            }
            else {
              deadLabel = (char *)this;
              pLVar9 = (LabelInstr *)PeepCm(this,&instr_00->super_Instr);
            }
            if (pLVar9 != (LabelInstr *)0x0) {
              cmpInstr = pLVar9;
            }
            instr_00 = (LabelInstr *)0x0;
            pLVar9 = cmpInstr;
            goto switchD_003f6cc9_caseD_18b;
          }
          branchInstr = (undefined **)IR::Instr::AsBranchInstr(&cmpInstr->super_Instr);
          pLVar9 = (LabelInstr *)Peeps::PeepBranch((BranchInstr *)branchInstr,(bool *)0x0);
          break;
        case ShrU_I4:
switchD_003f6cc9_caseD_1cc:
          if (!bVar3) {
            deadLabel = (char *)(cmpInstr->super_Instr).m_dst;
            pRVar10 = IR::Opnd::AsRegOpnd((Opnd *)deadLabel);
            if (((pRVar10->m_sym->field_0x18 & 1) != 0) &&
               ((pRVar10->m_sym->field_5).m_instrDef != (Instr *)0x0)) {
              deadLabel = (char *)(cmpInstr->super_Instr).m_src2;
              bVar4 = IR::Opnd::IsRegOpnd((Opnd *)deadLabel);
              if (bVar4) {
                pRVar10 = IR::Opnd::AsRegOpnd((cmpInstr->super_Instr).m_src2);
                deadLabel = (char *)pRVar10->m_sym;
                bVar4 = StackSym::IsTaggableIntConst((StackSym *)deadLabel);
                if (bVar4) {
                  pRVar10 = IR::Opnd::AsRegOpnd((cmpInstr->super_Instr).m_src2);
                  deadLabel = (char *)pRVar10->m_sym;
                  iVar6 = StackSym::GetIntConstValue((StackSym *)deadLabel);
                  bVar3 = iVar6 == 0;
                }
              }
            }
          }
          goto switchD_003f6cc9_caseD_18b;
        case CmUnGe_A:
        case CmUnGt_A:
        case CmUnLt_A:
        case CmUnLe_A:
        case CmUnLt_I4:
        case CmUnLe_I4:
        case CmUnGt_I4:
        case CmUnGe_I4:
          goto switchD_003f6cc9_caseD_1cf;
        case CmEq_I4:
        case CmNeq_I4:
        case CmLt_I4:
        case CmLe_I4:
        case CmGt_I4:
        case CmGe_I4:
switchD_003f6cc9_caseD_1d3:
          instr_00 = cmpInstr;
          if (bVar3) {
            deadLabel = (char *)this;
            UnsignedCmpPeep(this,&cmpInstr->super_Instr);
switchD_003f6cc9_caseD_1cf:
            instr_00 = cmpInstr;
          }
          goto switchD_003f6cc9_caseD_18b;
        default:
          switch(OVar1) {
          case Br:
          case BrNotHasSideEffects:
          case BrFncNeqApply:
          case BrEq_A:
          case BrNeq_A:
          case BrGe_A:
          case BrGt_A:
          case BrLt_A:
          case BrLe_A:
          case BrSrEq_A:
          case BrSrNeq_A:
          case BrOnHasLocalProperty:
          case BrOnObject_A:
          case BrNotNull_A:
          case BrOnNotNullObj_A:
            goto switchD_003f6cc9_caseD_18c;
          case BrFalse_A:
          case BrTrue_A:
            goto switchD_003f6cc9_caseD_1a6;
          case BrOnHasLocalEnvProperty:
          case EndSwitch:
          case Case:
          case BeginSwitch:
          case ProfiledBeginSwitch:
          case CallI:
          case CallIFlags:
          case CallIExtended:
          case CallIExtendedFlags:
          case Throw:
          case Ret:
          case Yield:
          case Incr_A:
          case Decr_A:
          case Neg_A:
          case Not_A:
          case Typeof:
          case TypeofElem:
          case ApplyArgs:
          case Add_A:
          case Div_A:
          case ProfiledDiv_A:
          case Mul_A:
          case Rem_A:
          case ProfiledRem_A:
          case Sub_A:
          case Expo_A:
          case And_A:
          case Or_A:
          case Xor_A:
          case Shl_A:
          case Shr_A:
            break;
          case ShrU_A:
            goto switchD_003f6cc9_caseD_1cc;
          case CmEq_A:
          case CmGe_A:
          case CmGt_A:
          case CmLt_A:
          case CmLe_A:
          case CmNeq_A:
          case CmSrEq_A:
          case CmSrNeq_A:
            goto switchD_003f6cc9_caseD_1d3;
          default:
            if ((((OVar1 - 0xe6 < 0x39) &&
                 ((0x1c0000130000001U >> ((ulong)(OVar1 - 0xe6) & 0x3f) & 1) != 0)) ||
                (OVar1 - 0x282 < 2)) || (OVar1 == BrOnNotEmpty)) goto switchD_003f6cc9_caseD_18c;
          }
        case FunctionEntry:
        case FunctionExit:
        case SpreadArrayLiteral:
        case ClearAttributes:
        case LdHomeObj:
        case LdFuncObj:
        case LdHomeObjProto:
        case LdFuncObjProto:
        case ImportCall:
        case BeginBodyScope:
        case SpreadObjectLiteral:
        case StPropIdArrFromVar:
        case Restify:
        case NewPropIdArrForCompProps:
        case Conv_Numeric:
        case Incr_Num_A:
        case Decr_Num_A:
        case ByteCodeLast:
        case LoweredStartCall:
        case BrOnNoEnvProperty:
        case BrOnException:
        case BrOnNoException:
        case DeadBrEqual:
        case DeadBrSrEqual:
        case DeadBrRelational:
        case DeadBrOnHasProperty:
        case DeletedNonHelperBranch:
        case Call:
        case AsmJsCallI:
        case AsmJsCallE:
        case CallINew:
        case CallINewTargetNew:
        case CallIExtendedNew:
        case CallIEval:
        case CallIExtendedNewTargetNew:
        case CallIDynamic:
        case CallIDynamicSpread:
        case CallDirect:
        case InlineThrow:
        case EHThrow:
        case Neg_I4:
        case Not_I4:
        case Add_I4:
        case Sub_I4:
        case Mul_I4:
        case Div_I4:
        case DivU_I4:
        case Rem_I4:
        case RemU_I4:
        case And_I4:
        case Or_I4:
        case Xor_I4:
        case Shl_I4:
        case Shr_I4:
        case Rol_I4:
        case Ror_I4:
          if ((cmpInstr->super_Instr).m_kind == InstrKindBranch) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            deadLabel = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x3b7,"(!instr->IsBranchInstr())","!instr->IsBranchInstr()");
            if (!bVar4) {
LAB_003f6f2a:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar7 = 0;
          }
          goto switchD_003f6cc9_caseD_18b;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void
FlowGraph::RunPeeps()
{
    if (this->func->HasTry())
    {
        return;
    }

    if (PHASE_OFF(Js::FGPeepsPhase, this->func))
    {
        return;
    }

    IR::Instr * instrCm = nullptr;
    bool tryUnsignedCmpPeep = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch(instr->m_opcode)
        {
        case Js::OpCode::Br:
        case Js::OpCode::BrEq_I4:
        case Js::OpCode::BrGe_I4:
        case Js::OpCode::BrGt_I4:
        case Js::OpCode::BrLt_I4:
        case Js::OpCode::BrLe_I4:
        case Js::OpCode::BrUnGe_I4:
        case Js::OpCode::BrUnGt_I4:
        case Js::OpCode::BrUnLt_I4:
        case Js::OpCode::BrUnLe_I4:
        case Js::OpCode::BrNeq_I4:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrUnGe_A:
        case Js::OpCode::BrUnGt_A:
        case Js::OpCode::BrUnLt_A:
        case Js::OpCode::BrUnLe_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrNotNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrNotNull_A:
        case Js::OpCode::BrNotAddr_A:
        case Js::OpCode::BrAddr_A:
        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrHasSideEffects:
        case Js::OpCode::BrNotHasSideEffects:
        case Js::OpCode::BrFncEqApply:
        case Js::OpCode::BrFncNeqApply:
        case Js::OpCode::BrOnEmpty:
        case Js::OpCode::BrOnNotEmpty:
        case Js::OpCode::BrFncCachedScopeEq:
        case Js::OpCode::BrFncCachedScopeNeq:
        case Js::OpCode::BrOnObject_A:
        case Js::OpCode::BrOnClassConstructor:
        case Js::OpCode::BrOnBaseConstructorKind:
        case Js::OpCode::BrOnObjectOrNull_A:
        case Js::OpCode::BrOnNotNullObj_A:
        case Js::OpCode::BrOnConstructor_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
            instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            break;

        case Js::OpCode::MultiBr:
            // TODO: Run peeps on these as well...
            break;

        case Js::OpCode::BrTrue_I4:
        case Js::OpCode::BrFalse_I4:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instrCm)
            {
                if (instrCm->GetDst()->IsInt32())
                {
                    Assert(instr->m_opcode == Js::OpCode::BrTrue_I4 || instr->m_opcode == Js::OpCode::BrFalse_I4);
                    instrNext = this->PeepTypedCm(instrCm);
                }
                else
                {
                    instrNext = this->PeepCm(instrCm);
                }
                instrCm = nullptr;

                if (instrNext == nullptr)
                {
                    // Set instrNext back to the current instr.
                    instrNext = instr;
                }
            }
            else
            {
                instrNext = Peeps::PeepBranch(instr->AsBranchInstr());
            }
            break;

        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmSrNeq_A:
            if (tryUnsignedCmpPeep)
            {
                this->UnsignedCmpPeep(instr);
            }
        case Js::OpCode::CmUnGe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGe_A:
        case Js::OpCode::CmUnGt_A:
        case Js::OpCode::CmUnLt_A:
        case Js::OpCode::CmUnLe_A:
            // There may be useless branches between the Cm instr and the branch that uses the result.
            // So save the last Cm instr seen, and trigger the peep on the next BrTrue/BrFalse.
            instrCm = instr;
            break;

        case Js::OpCode::Label:
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                instrNext = Peeps::PeepUnreachableLabel(instr->AsLabelInstr(), false);
            }
            break;

        case Js::OpCode::StatementBoundary:
            instr->ClearByteCodeOffset();
            instr->SetByteCodeOffset(instr->GetNextRealInstrOrLabel());
            break;

        case Js::OpCode::ShrU_I4:
        case Js::OpCode::ShrU_A:
            if (tryUnsignedCmpPeep)
            {
                break;
            }
            if (instr->GetDst()->AsRegOpnd()->m_sym->IsSingleDef()
                && instr->GetSrc2()->IsRegOpnd() && instr->GetSrc2()->AsRegOpnd()->m_sym->IsTaggableIntConst()
                && instr->GetSrc2()->AsRegOpnd()->m_sym->GetIntConstValue() == 0)
            {
                tryUnsignedCmpPeep = true;
            }
            break;
        default:
            Assert(!instr->IsBranchInstr());
        }
   } NEXT_INSTR_IN_FUNC_EDITING;
}